

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall JetHead::ServerSocket::ServerSocket(ServerSocket *this,bool sock_stream)

{
  int iVar1;
  linger l;
  
  Socket::Socket(&this->super_Socket,sock_stream);
  (this->super_Socket).super_SelectorListener._vptr_SelectorListener =
       (_func_int **)&PTR_processFileEvents_001308e0;
  (this->super_Socket).super_IReaderWriter._vptr_IReaderWriter =
       (_func_int **)&PTR__ServerSocket_00130928;
  l.l_onoff = 1;
  l.l_linger = 5;
  iVar1 = setsockopt((this->super_Socket).mFd,1,0xd,&l,8);
  if (iVar1 != 0) {
    jh_log_print(2,"JetHead::ServerSocket::ServerSocket(bool)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x330,"Failed to set linger");
  }
  return;
}

Assistant:

ServerSocket::ServerSocket( bool sock_stream ) : Socket( sock_stream )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct linger l = { true, 5 };

	int res = setsockopt( getFd(), SOL_SOCKET, SO_LINGER, &l, sizeof( l ) );

	if ( res != 0 )
		LOG_WARN( "Failed to set linger" );
}